

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O3

int32 accum_gauden(float32 ***denacc,uint32 *lcl2gbl,uint32 n_lcl2gbl,vector_t *frame,
                  uint32 ***den_idx,gauden_t *g,int32 mean_reest,int32 var_reest,int32 pass2var,
                  float32 ***wacc,int32 var_is_full,FILE *pdumpfh,feat_t *fcb)

{
  float x;
  uint uVar1;
  uint uVar2;
  vector_t ***ppppfVar3;
  vector_t ***ppppfVar4;
  vector_t ***ppppfVar5;
  vector_t ****pppppfVar6;
  float32 ***pppfVar7;
  vector_t pfVar8;
  uint32 *puVar9;
  float32 *pfVar10;
  vector_t pfVar11;
  float32 **a;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  vector_t x_00;
  ulong uVar15;
  vector_t pfVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  vector_t pfVar20;
  float32 **local_d8;
  float32 *local_c8;
  
  if (n_lcl2gbl != 0) {
    ppppfVar3 = g->mean;
    ppppfVar4 = g->l_macc;
    ppppfVar5 = g->l_vacc;
    pppppfVar6 = g->l_fullvacc;
    pppfVar7 = g->l_dnom;
    uVar1 = g->n_top;
    uVar18 = (ulong)g->n_feat;
    uVar2 = g->n_density;
    uVar15 = 0;
    pfVar16 = (vector_t)0x0;
    pfVar20 = (vector_t)0x0;
    local_c8 = (float32 *)0x0;
    local_d8 = (float32 **)0x0;
    do {
      if ((int)uVar18 == 0) {
        uVar18 = 0;
      }
      else {
        uVar17 = 0;
        do {
          pfVar8 = frame[uVar17];
          puVar9 = den_idx[uVar15][uVar17];
          pfVar10 = denacc[uVar15][uVar17];
          if (var_is_full != 0) {
            ckd_free_2d(local_d8);
            local_d8 = (float32 **)
                       __ckd_calloc_2d__((ulong)g->veclen[uVar17],(ulong)g->veclen[uVar17],4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/accum.c"
                                         ,0xe3);
            ckd_free(local_c8);
            local_c8 = (float32 *)
                       __ckd_calloc__((ulong)g->veclen[uVar17],4,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/accum.c"
                                      ,0xe5);
          }
          if ((ulong)uVar1 != 0) {
            uVar18 = 0;
            do {
              uVar12 = (uint)uVar18;
              if (uVar1 != uVar2) {
                uVar12 = puVar9[uVar18];
              }
              uVar19 = (ulong)uVar12;
              x = (float)pfVar10[uVar19];
              if (1.2e-38 < x) {
                if (pdumpfh != (FILE *)0x0) {
                  fprintf((FILE *)pdumpfh,"%u %u %u %g\n",(double)x,(ulong)lcl2gbl[uVar15],
                          uVar17 & 0xffffffff,uVar19);
                }
                pfVar11 = ppppfVar4[uVar15][uVar17][uVar19];
                if (pass2var != 0) {
                  pfVar16 = ppppfVar3[lcl2gbl[uVar15]][uVar17][uVar19];
                }
                if (var_reest != 0) {
                  if (var_is_full == 0) {
                    pfVar20 = ppppfVar5[uVar15][uVar17][uVar19];
                  }
                  else {
                    a = (float32 **)pppppfVar6[uVar15][uVar17][uVar19];
                    uVar12 = g->veclen[uVar17];
                    x_00 = pfVar8;
                    if ((pass2var != 0) && (x_00 = (vector_t)local_c8, (ulong)uVar12 != 0)) {
                      uVar13 = 0;
                      do {
                        local_c8[uVar13] = (float32)(pfVar8[uVar13] - pfVar16[uVar13]);
                        uVar13 = uVar13 + 1;
                      } while (uVar12 != uVar13);
                    }
                    outerproduct(local_d8,(float32 *)x_00,(float32 *)x_00,uVar12);
                    scalarmultiply(local_d8,(float32)x,g->veclen[uVar17]);
                    matrixadd(a,local_d8,g->veclen[uVar17]);
                  }
                }
                if ((mean_reest != 0) && (uVar12 = g->veclen[uVar17], (ulong)uVar12 != 0)) {
                  uVar13 = 0;
                  do {
                    pfVar11[uVar13] = pfVar8[uVar13] * x + pfVar11[uVar13];
                    uVar13 = uVar13 + 1;
                  } while (uVar12 != uVar13);
                }
                if (var_reest != 0 && var_is_full == 0) {
                  uVar13 = (ulong)g->veclen[uVar17];
                  if (pass2var == 0) {
                    if (uVar13 != 0) {
                      uVar14 = 0;
                      do {
                        pfVar20[uVar14] = x * pfVar8[uVar14] * pfVar8[uVar14] + pfVar20[uVar14];
                        uVar14 = uVar14 + 1;
                      } while (uVar13 != uVar14);
                    }
                  }
                  else if (uVar13 != 0) {
                    uVar14 = 0;
                    do {
                      pfVar20[uVar14] =
                           (pfVar8[uVar14] - pfVar16[uVar14]) * (pfVar8[uVar14] - pfVar16[uVar14]) *
                           x + pfVar20[uVar14];
                      uVar14 = uVar14 + 1;
                    } while (uVar13 != uVar14);
                  }
                }
                pppfVar7[uVar15][uVar17][uVar19] =
                     (float32)(x + (float)pppfVar7[uVar15][uVar17][uVar19]);
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 != uVar1);
          }
          if (var_is_full != 0) {
            ckd_free_2d(local_d8);
            ckd_free(local_c8);
            local_d8 = (float32 **)0x0;
            local_c8 = (float32 *)0x0;
          }
          uVar17 = uVar17 + 1;
          uVar18 = (ulong)g->n_feat;
        } while (uVar17 < uVar18);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != n_lcl2gbl);
  }
  if (pdumpfh != (FILE *)0x0) {
    fputs("\n",(FILE *)pdumpfh);
  }
  return 0;
}

Assistant:

int
accum_gauden(float32 ***denacc,
	     uint32 *lcl2gbl,
	     uint32 n_lcl2gbl,
	     vector_t *frame,
	     uint32 ***den_idx,
	     gauden_t *g,
	     int32 mean_reest,
	     int32 var_reest,
	     int32 pass2var,
	     float32 ***wacc,
	     int32 var_is_full,
	     FILE *pdumpfh,
	     feat_t* fcb)
{
    uint32 g_i, i, j, k, kk, l;

    vector_t ***macc = g->l_macc;	/* local to utt */
    vector_t m;
    vector_t ***mean = g->mean;
    vector_t pm = NULL;

    vector_t ***vacc = g->l_vacc;
    vector_t v = NULL;

    vector_t ****fullvacc = g->l_fullvacc;
    vector_t *fv = NULL;
    vector_t *cov = NULL;
    vector_t dvec = NULL;

    float32 ***dnom = g->l_dnom;

    float32 diff;
    float32 obs_cnt;
    
    int n_top = gauden_n_top(g);
    int n_density = gauden_n_density(g);

    /* for each density family found in the utterance */
    for (i = 0; i < n_lcl2gbl; i++) {

	g_i = lcl2gbl[i];

	/* for each feature */
	for (j = 0; j < gauden_n_feat(g); j++) {
	    vector_t feat = frame[j];
	    uint32* den_idx_row = den_idx[i][j];
	    float32* denacc_row = denacc[i][j];

	    if (var_is_full) {
		ckd_free_2d((void **)cov);
		cov = (vector_t *)ckd_calloc_2d(g->veclen[j], g->veclen[j], sizeof(float32));
		ckd_free(dvec);
		dvec = ckd_calloc(g->veclen[j], sizeof(float32));
	    }
	    

	    /* for each density in the mixture density */
	    for (kk = 0; kk < n_top; kk++) {
		
		if (n_top == n_density)
		    k = kk;
		else
		    k = den_idx_row[kk];	/* i.e. density k is one of the n_top densities */
		
		obs_cnt = denacc_row[k];	/* observation count for density (k) at this time frame
						   given the model */
		
		/* don't bother adding a bunch of
		   essentially zero values */
		if (obs_cnt <= MIN_POS_FLOAT32)
		    continue;

#ifdef ACCUM_VERBOSE
		printf("denacc[%u][%u][%3u] == %.3e\n", i, j, k, obs_cnt);
#endif
		if (pdumpfh)
			fprintf(pdumpfh, "%u %u %u %g\n", lcl2gbl[i], j, k, obs_cnt);

		m = macc[i][j][k];	/* the vector accumulator for mean (i,j,k) */

		if (pass2var) {
		    g_i = lcl2gbl[i];
		    pm = mean[g_i][j][k];	/* the mean (i, j, k) */
		}

		if (var_reest) {
		    if (var_is_full)
			fv = fullvacc[i][j][k];
		    else
			v = vacc[i][j][k];	/* the vector accumulator for variance (i,j,k) */
		}

		if (var_reest && var_is_full) {
		    if (!pass2var)
			outerproduct(cov, feat, feat, g->veclen[j]);
		    else {
			for (l = 0; l < g->veclen[j]; ++l)
			    dvec[l] = feat[l] - pm[l];
			outerproduct(cov, dvec, dvec, g->veclen[j]);
		    }
		    scalarmultiply(cov, obs_cnt, g->veclen[j]);
		    matrixadd(fv, cov, g->veclen[j]);
		}

    	        if (mean_reest) {
		    for (l = 0; l < g->veclen[j]; l++) {
			m[l] += obs_cnt * feat[l];
		    }
		}
		
		if (var_reest && !var_is_full) {
		    if (!pass2var) {
			for (l = 0; l < g->veclen[j]; l++) {
			    /* Always reest vars on untransformed features for now */
			    /* This does NOT work with -2passvar no (for pretty obvious reasons) */
			    v[l] += obs_cnt * feat[l] * feat[l];
			}
		    } else {
			for (l = 0; l < g->veclen[j]; l++) {
			    diff = feat[l] - pm[l];    
			    diff *= diff;
			    v[l] += obs_cnt * diff;
			}
		    }
		}

		/* accumulate observation count for all densities */
		dnom[i][j][k] += obs_cnt;
	    }
	    if (var_is_full) {
		ckd_free_2d((void **)cov);
		cov = NULL;
		ckd_free(dvec);
		dvec = NULL;
	    }
	}
    }

    if (pdumpfh)
	    fputs("\n", pdumpfh);

    return S3_SUCCESS;
}